

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

string * __thiscall
re2::DFA::DumpState_abi_cxx11_(string *__return_storage_ptr__,DFA *this,State *state)

{
  allocator *paVar1;
  char *pcVar2;
  int i;
  long lVar3;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  
  if (this == (DFA *)0x2) {
    pcVar2 = "*";
    paVar1 = &local_33;
  }
  else if (this == (DFA *)0x1) {
    pcVar2 = "X";
    paVar1 = &local_32;
  }
  else {
    if (this != (DFA *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      StringAppendF(__return_storage_ptr__,"(%p)",this);
      pcVar2 = "";
      for (lVar3 = 0; lVar3 < (int)this->kind_; lVar3 = lVar3 + 1) {
        if (this->prog_->inst_count_[lVar3 + -10] == -1) {
          StringAppendF(__return_storage_ptr__,"|",pcVar2);
          pcVar2 = "";
        }
        else {
          StringAppendF(__return_storage_ptr__,"%s%d",pcVar2);
          pcVar2 = ",";
        }
      }
      StringAppendF(__return_storage_ptr__," flag=%#x",(ulong)*(uint *)&this->init_failed_);
      return __return_storage_ptr__;
    }
    pcVar2 = "_";
    paVar1 = &local_31;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

string DFA::DumpState(State* state) {
  if (state == NULL)
    return "_";
  if (state == DeadState)
    return "X";
  if (state == FullMatchState)
    return "*";
  string s;
  const char* sep = "";
  StringAppendF(&s, "(%p)", state);
  for (int i = 0; i < state->ninst_; i++) {
    if (state->inst_[i] == Mark) {
      StringAppendF(&s, "|");
      sep = "";
    } else {
      StringAppendF(&s, "%s%d", sep, state->inst_[i]);
      sep = ",";
    }
  }
  StringAppendF(&s, " flag=%#x", state->flag_);
  return s;
}